

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream * QtPrivate::writeSequentialContainer<QList<int>>(QDataStream *s,QList<int> *c)

{
  ulong uVar1;
  long lVar2;
  int *piVar3;
  QDataStream *this;
  int iVar4;
  long lVar5;
  
  uVar1 = (c->d).size;
  if (uVar1 >> 1 < 0x7fffffff) {
    iVar4 = (int)uVar1;
  }
  else {
    if (0x15 < *(int *)(s + 0x18)) {
      this = (QDataStream *)QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,uVar1);
      goto LAB_0017ab89;
    }
    if (uVar1 != 0xfffffffe) {
      QDataStream::setStatus((Status)s);
      return s;
    }
    iVar4 = -2;
  }
  QDataStream::operator<<(s,iVar4);
LAB_0017ab89:
  lVar2 = (c->d).size;
  if (lVar2 != 0) {
    piVar3 = (c->d).ptr;
    lVar5 = 0;
    do {
      QDataStream::operator<<(s,*(int *)((long)piVar3 + lVar5));
      lVar5 = lVar5 + 4;
    } while (lVar2 << 2 != lVar5);
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}